

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

us_socket_context_t *
us_create_child_socket_context(int ssl,us_socket_context_t *context,int context_ext_size)

{
  us_internal_ssl_socket_context_t *puVar1;
  us_socket_context_t *puVar2;
  us_socket_context_options_t options;
  
  if (ssl != 0) {
    puVar1 = us_internal_create_child_ssl_socket_context
                       ((us_internal_ssl_socket_context_t *)context,context_ext_size);
    return &puVar1->sc;
  }
  puVar2 = us_create_socket_context
                     (0,context->loop,context_ext_size,
                      (us_socket_context_options_t)ZEXT1648(ZEXT816(0)));
  return puVar2;
}

Assistant:

struct us_socket_context_t *us_create_child_socket_context(int ssl, struct us_socket_context_t *context, int context_ext_size) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return (struct us_socket_context_t *) us_internal_create_child_ssl_socket_context((struct us_internal_ssl_socket_context_t *) context, context_ext_size);
    }
#endif

    /* For TCP we simply create a new context as nothing is shared */
    struct us_socket_context_options_t options = {0};
    return us_create_socket_context(ssl, context->loop, context_ext_size, options);
}